

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

IssuanceParameter *
cfd::core::ConfidentialTransaction::CalculateIssuanceValue
          (IssuanceParameter *__return_storage_ptr__,Txid *txid,uint32_t vout,bool is_blind,
          ByteData256 *contract_hash,ByteData256 *asset_entropy)

{
  ByteData256 *this;
  ByteData *this_00;
  bool bVar1;
  ConfidentialAssetId asset;
  BlindFactor entropy;
  ConfidentialAssetId token;
  bool local_111;
  ConfidentialAssetId *local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_108;
  undefined1 local_100 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  uint8_t local_e0;
  uint32_t local_d4;
  undefined1 local_d0 [80];
  undefined4 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->entropy)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  this = &(__return_storage_ptr__->entropy).data_;
  local_111 = is_blind;
  local_d4 = vout;
  ByteData256::ByteData256(this);
  (__return_storage_ptr__->asset)._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_00735710;
  local_108 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              &(__return_storage_ptr__->asset).data_;
  ByteData::ByteData((ByteData *)local_108);
  local_110 = &__return_storage_ptr__->asset;
  (__return_storage_ptr__->asset).version_ = '\0';
  (__return_storage_ptr__->token)._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_00735710;
  this_00 = &(__return_storage_ptr__->token).data_;
  ByteData::ByteData(this_00);
  (__return_storage_ptr__->token).version_ = '\0';
  bVar1 = ByteData256::Equals(asset_entropy,(ByteData256 *)kEmptyByteData256);
  if (bVar1) {
    CalculateAssetEntropy((BlindFactor *)local_d0,txid,local_d4,contract_hash);
    if ((IssuanceParameter *)local_d0 != __return_storage_ptr__) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 8));
    }
    CalculateAsset((ConfidentialAssetId *)local_100,(BlindFactor *)local_d0);
    if (local_110 != (ConfidentialAssetId *)local_100) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_108,&local_f8);
      (__return_storage_ptr__->asset).version_ = local_e0;
    }
    CalculateReissuanceToken
              ((ConfidentialAssetId *)(local_d0 + 0x20),(BlindFactor *)local_d0,local_111);
    if (&__return_storage_ptr__->token != (ConfidentialAssetId *)(local_d0 + 0x20)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 0x28));
      (__return_storage_ptr__->token).version_ = local_d0[0x40];
    }
    local_d0._72_8_ = "cfdcore_elements_transaction.cpp";
    local_80 = 0x864;
    local_78 = "CalculateIssuanceValue";
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_50,local_110);
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&__return_storage_ptr__->token);
    logger::log<std::__cxx11::string&,std::__cxx11::string&,bool&>
              ((CfdSourceLocation *)(local_d0 + 0x48),kCfdLogLevelInfo,
               "asset[{}] token[{}] is_blind[{}]",&local_50,&local_70,&local_111);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_d0._32_8_ = &PTR__ConfidentialAssetId_00735710;
    if ((pointer)local_d0._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._40_8_);
    }
    local_100 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_d0._0_8_ = &PTR__BlindFactor_007354b0;
  }
  else {
    local_100 = (undefined1  [8])&PTR__BlindFactor_007354b0;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
               &contract_hash->data_);
    if ((IssuanceParameter *)local_100 != __return_storage_ptr__) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_f8);
    }
    local_100 = (undefined1  [8])&PTR__BlindFactor_007354b0;
    if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    CalculateAsset((ConfidentialAssetId *)local_100,&__return_storage_ptr__->entropy);
    if (local_110 != (ConfidentialAssetId *)local_100) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_108,&local_f8);
      (__return_storage_ptr__->asset).version_ = local_e0;
    }
    local_100 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
    local_d0._8_8_ =
         local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if ((pointer)local_d0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::CalculateIssuanceValue(
    const Txid &txid, uint32_t vout, bool is_blind,
    const ByteData256 &contract_hash, const ByteData256 &asset_entropy) {
  IssuanceParameter result;

  if (!asset_entropy.Equals(kEmptyByteData256)) {
    // reissue
    result.entropy = BlindFactor(contract_hash);
    result.asset = CalculateAsset(
        result.entropy);  // ConfidentialAssetId(ByteData(asset));
    return result;
  }

  // calculate issue value
  const BlindFactor entropy = CalculateAssetEntropy(txid, vout, contract_hash);
  result.entropy = entropy;

  // calculate asset value
  const ConfidentialAssetId asset = CalculateAsset(entropy);
  result.asset = asset;

  // calculate token
  const ConfidentialAssetId token =
      CalculateReissuanceToken(entropy, is_blind);
  result.token = token;

  info(
      CFD_LOG_SOURCE, "asset[{}] token[{}] is_blind[{}]",
      result.asset.GetHex(), result.token.GetHex(), is_blind);
  return result;
}